

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.cpp
# Opt level: O0

int __thiscall Httpdata::handle_event(Httpdata *this)

{
  TimeRoundItem<channel> *this_00;
  SP_TimeRoundItemNode<channel> *this_01;
  shared_ptr<TimeRoundItem<channel>_> local_d0;
  SP_TimeRoundItemNode<channel> *local_c0;
  SP_TimeRoundItemNode<channel> *sp_time_round_item_node;
  undefined1 local_a1;
  enable_shared_from_this<channel> local_a0 [2];
  __shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2> local_80;
  element_type *local_70;
  code *local_68;
  undefined8 local_60;
  type local_58;
  Fun local_40;
  undefined1 local_20 [8];
  shared_ptr<TimeRoundItem<channel>_> sp_time_round_item;
  Httpdata *this_local;
  
  sp_time_round_item.super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (((this->super_channel).Revent & 1) == 0) {
    if (((this->super_channel).Revent & 4) != 0) {
      (*(this->super_channel)._vptr_channel[5])();
    }
  }
  else {
    (*(this->super_channel)._vptr_channel[4])();
    if (((this->super_channel).accept_epoll == (Epoll *)0x0) &&
       (0 < (this->super_channel).read_length)) {
      handle_http(this,(this->super_channel).read_buff);
      (*(this->super_channel)._vptr_channel[7])();
      if (((this->super_channel).time_round != (TimeRound<channel> *)0x0) &&
         (((this->super_channel).field_0x8c & 1) != 0)) {
        this_00 = (TimeRoundItem<channel> *)operator_new(0x38);
        local_a1 = 1;
        local_68 = channel::Close;
        local_60 = 0;
        std::enable_shared_from_this<channel>::shared_from_this
                  ((enable_shared_from_this<channel> *)&local_80);
        local_70 = std::__shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>::get(&local_80);
        std::bind<void(channel::*)(),channel*>
                  (&local_58,(offset_in_channel_to_subr *)&local_68,&local_70);
        std::function<void()>::function<std::_Bind<void(channel::*(channel*))()>,void>
                  ((function<void()> *)&local_40,&local_58);
        std::enable_shared_from_this<channel>::shared_from_this(local_a0);
        TimeRoundItem<channel>::TimeRoundItem(this_00,5,&local_40,(shared_ptr<channel> *)local_a0);
        local_a1 = 0;
        std::shared_ptr<TimeRoundItem<channel>>::shared_ptr<TimeRoundItem<channel>,void>
                  ((shared_ptr<TimeRoundItem<channel>> *)local_20,this_00);
        std::shared_ptr<channel>::~shared_ptr((shared_ptr<channel> *)local_a0);
        std::function<void_()>::~function(&local_40);
        std::shared_ptr<channel>::~shared_ptr((shared_ptr<channel> *)&local_80);
        std::weak_ptr<TimeRoundItem<channel>>::weak_ptr<TimeRoundItem<channel>,void>
                  ((weak_ptr<TimeRoundItem<channel>> *)&sp_time_round_item_node,
                   (shared_ptr<TimeRoundItem<channel>_> *)local_20);
        std::weak_ptr<TimeRoundItem<channel>_>::operator=
                  (&(this->super_channel).wp_time_round_item,
                   (weak_ptr<TimeRoundItem<channel>_> *)&sp_time_round_item_node);
        std::weak_ptr<TimeRoundItem<channel>_>::~weak_ptr
                  ((weak_ptr<TimeRoundItem<channel>_> *)&sp_time_round_item_node);
        this_01 = (SP_TimeRoundItemNode<channel> *)operator_new(0x20);
        std::shared_ptr<TimeRoundItem<channel>_>::shared_ptr
                  (&local_d0,(shared_ptr<TimeRoundItem<channel>_> *)local_20);
        SP_TimeRoundItemNode<channel>::SP_TimeRoundItemNode(this_01,&local_d0);
        std::shared_ptr<TimeRoundItem<channel>_>::~shared_ptr(&local_d0);
        local_c0 = this_01;
        TimeRound<channel>::AddTimeRoundItemNode((this->super_channel).time_round,this_01);
        std::shared_ptr<TimeRoundItem<channel>_>::~shared_ptr
                  ((shared_ptr<TimeRoundItem<channel>_> *)local_20);
      }
    }
  }
  (this->super_channel).Revent = 0;
  return 0;
}

Assistant:

int Httpdata::handle_event()
{
    if(Revent & EPOLLIN)
    {
        HandleRead();
        if(accept_epoll == nullptr)
        {
            //cout<<"recv data from client: "<<fd<<" "<<buff<<endl;
            //有读取到数据才需要处理
            if(read_length > 0)
            {
                handle_http(read_buff);
                SeparateTimer();
                if(time_round != nullptr && Keep_Alive)
                {
                    std::shared_ptr<TimeRoundItem<channel>> sp_time_round_item(new TimeRoundItem<channel>(5,bind(&Httpdata::Close,shared_from_this().get()),shared_from_this()));
                    wp_time_round_item = std::weak_ptr<TimeRoundItem<channel>>(sp_time_round_item);
                    SP_TimeRoundItemNode<channel>* sp_time_round_item_node = new SP_TimeRoundItemNode<channel>(sp_time_round_item);
                    time_round->AddTimeRoundItemNode(sp_time_round_item_node);
                }
            }
        }
    }
    else if(Revent & EPOLLOUT)
    {
        HandleWrite();
    }
    Revent = 0;
    return 0;
}